

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xsd_generator.cc
# Opt level: O1

void __thiscall t_xsd_generator::init_generator(t_xsd_generator *this)

{
  ofstream_with_content_based_conditional_update *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int *piVar3;
  long *plVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs;
  long *plVar6;
  size_type *psVar7;
  string f_php_name;
  allocator local_89;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  char *local_48 [2];
  char local_38 [16];
  
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(&local_68,this);
  iVar2 = mkdir(local_68._M_dataplus._M_p,0x1ff);
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (iVar2 == -1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_48,this);
      std::__cxx11::string::string((string *)&local_88,local_48[0],&local_89);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_68._M_dataplus._M_p = (pointer)*plVar4;
      psVar7 = (size_type *)(plVar4 + 2);
      if ((size_type *)local_68._M_dataplus._M_p == psVar7) {
        local_68.field_2._M_allocated_capacity = *psVar7;
        local_68.field_2._8_8_ = plVar4[3];
        local_68._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_68.field_2._M_allocated_capacity = *psVar7;
      }
      local_68._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      __rhs = strerror(*piVar3);
      std::operator+(__return_storage_ptr__,&local_68,__rhs);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  (*(this->super_t_generator)._vptr_t_generator[0x1b])(local_48,this);
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_48,
                              (ulong)(((this->super_t_generator).program_)->name_)._M_dataplus._M_p)
  ;
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_78 = *plVar6;
    lStack_70 = plVar4[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar6;
    local_88 = (long *)*plVar4;
  }
  local_80 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_88);
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_68.field_2._M_allocated_capacity = *psVar7;
    local_68.field_2._8_8_ = plVar4[3];
    local_68._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_68.field_2._M_allocated_capacity = *psVar7;
    local_68._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_68._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  std::__cxx11::string::string((string *)&local_88,local_68._M_dataplus._M_p,(allocator *)local_48);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->f_php_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.
              field_0x70);
  this_00 = &this->f_php_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::clear_buf
            (this_00);
  (this->f_php_).super_ostringstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x90 =
       0;
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"<?php",5);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this_00,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  (*(this->super_t_generator)._vptr_t_generator[0x1c])(&local_88,this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_88,local_80);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_88 != &local_78) {
    operator_delete(local_88);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_xsd_generator::init_generator() {
  // Make output directory
  MKDIR(get_out_dir().c_str());

  // Make output file
  string f_php_name = get_out_dir() + program_->get_name() + "_xsd.php";
  f_php_.open(f_php_name.c_str());

  f_php_ << "<?php" << endl
         << autogen_comment() << endl;
}